

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  char cVar4;
  size_t sVar5;
  pointer pcVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  char tempname [1024];
  string local_488;
  long local_468;
  int *local_460;
  string local_458;
  char local_438 [1032];
  
  lVar14 = (long)gargp;
  local_460 = running;
  if (*running == 0) {
    lVar13 = (long)gargp;
    pbVar2 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = pbVar2[lVar13]._M_dataplus._M_p;
    local_468 = lVar13;
    if (pcVar6[1] == this->m_optionFlag) {
      lVar9 = 2;
      lVar14 = 0;
      while( true ) {
        *position = (int)lVar9;
        cVar4 = pcVar6[lVar9];
        if ((cVar4 == '\0') || (cVar4 == '=')) break;
        local_438[lVar9 + -2] = cVar4;
        lVar9 = lVar9 + 1;
        pcVar6 = pbVar2[lVar13]._M_dataplus._M_p;
        lVar14 = lVar14 + 0x100000000;
      }
      local_438[lVar14 >> 0x20] = '\0';
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      sVar5 = strlen(local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_488,local_438,local_438 + sVar5);
      cVar4 = getType(this,&local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p);
      }
      if (cVar4 == -1) {
        this->m_optionsArgument = 1;
        goto LAB_0011165a;
      }
      if ((this->m_oargv).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p[*position] == '=') {
        if (cVar4 == 'b') {
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Error: boolean variable cannot have any options: ");
          pcVar12 = local_438;
          goto LAB_00111691;
        }
        *position = *position + 1;
      }
      bVar3 = false;
      lVar14 = local_468;
    }
    else {
      *position = 1;
      local_438[0] = pcVar6[1];
      local_438[1] = 0;
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      sVar5 = strlen(local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_488,local_438,local_438 + sVar5);
      cVar4 = getType(this,&local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p);
      }
      if (cVar4 != 'b') goto LAB_0011148b;
      bVar3 = true;
      cVar4 = 'b';
      lVar14 = local_468;
    }
  }
  else {
    iVar7 = *position;
    *position = iVar7 + 1;
    local_438[0] = (this->m_oargv).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14]._M_dataplus._M_p
                   [(long)iVar7 + 1];
    local_438[1] = 0;
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    sVar5 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_488,local_438,local_438 + sVar5);
    cVar4 = getType(this,&local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    if (cVar4 == 'b') {
      bVar3 = true;
      cVar4 = 'b';
    }
    else {
      *local_460 = 0;
LAB_0011148b:
      *position = *position + 1;
      if (cVar4 == -1) {
LAB_0011165a:
        this->m_optionsArgument = 1;
        *position = 0;
        return gargp + 1;
      }
      bVar3 = true;
    }
  }
  pbVar2 = (this->m_oargv).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = *position;
  if ((cVar4 != 'b') && (pbVar2[lVar14]._M_dataplus._M_p[iVar7] == '\0')) {
    gargp = gargp + 1;
    *position = 0;
    iVar7 = 0;
  }
  if (bVar3 && cVar4 == 'b') {
    pcVar6 = pbVar2[gargp]._M_dataplus._M_p;
    iVar8 = 1;
    if (pcVar6[(long)iVar7 + 1] == '\0') {
LAB_0011158f:
      if (pcVar6[(long)iVar7 + 1] != '\0') goto LAB_0011159f;
      iVar8 = 0;
    }
    *local_460 = iVar8;
  }
  else if (cVar4 == 'b') {
    pcVar6 = pbVar2[gargp]._M_dataplus._M_p;
    goto LAB_0011158f;
  }
LAB_0011159f:
  if (gargp < this->m_oargc) {
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    sVar5 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_488,local_438,local_438 + sVar5);
    pcVar6 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[gargp]._M_dataplus._M_p;
    pcVar12 = pcVar6 + *position;
    paVar1 = &local_458.field_2;
    local_458._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar6 == (pointer)0x0) {
      pcVar10 = (char *)0x1;
    }
    else {
      sVar5 = strlen(pcVar12);
      pcVar10 = pcVar12 + sVar5;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,pcVar12,pcVar10);
    setModified(this,&local_488,&local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != paVar1) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    return gargp + (uint)(*local_460 == 0);
  }
  poVar11 = (ostream *)&std::cerr;
  pcVar12 = "Error: last option requires a parameter";
LAB_00111691:
  poVar11 = std::operator<<(poVar11,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
   int optionForm;
   char tempname[1024];
   char optionType = '\0';

   if (running) {
      optionForm = OPTION_FORM_CONTINUE;
   } else if (m_oargv[gargp][1] == getFlag()) {
      optionForm = OPTION_FORM_LONG;
   } else {
      optionForm = OPTION_FORM_SHORT;
   }

   switch (optionForm) {
      case OPTION_FORM_CONTINUE:
         position++;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            running = 0;
            position++;
         }
         break;
      case OPTION_FORM_SHORT:
         position = 1;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            position++;
         }
         break;
      case OPTION_FORM_LONG:
         position = 2;
         while (m_oargv[gargp][position] != '=' &&
               m_oargv[gargp][position] != '\0') {
            tempname[position-2] = m_oargv[gargp][position];
            position++;
         }
         tempname[position-2] = '\0';
         optionType = getType(tempname);
         if (optionType == -1) {         // suppressed --options option
            m_optionsArgument = 1;
            break;
         }
         if (m_oargv[gargp][position] == '=') {
            if (optionType == OPTION_BOOLEAN_TYPE) {
               std::cerr << "Error: boolean variable cannot have any options: "
                    << tempname << std::endl;
               exit(1);
            }
            position++;
         }
         break;
   }

   if (optionType == -1) {              // suppressed --options option
      m_optionsArgument = 1;
      gargp++;
      position = 0;
      return gargp;
   }

   if (m_oargv[gargp][position] == '\0' &&
         optionType != OPTION_BOOLEAN_TYPE) {
      gargp++;
      position = 0;
   }

   if (optionForm != OPTION_FORM_LONG && optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] != '\0') {
      running = 1;
   } else if (optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] == '\0') {
      running = 0;
   }

   if (gargp >= m_oargc) {
      std::cerr << "Error: last option requires a parameter" << std::endl;
      exit(1);
   }
   setModified(tempname, &m_oargv[gargp][position]);

   if (!running) {
      gargp++;
   }
   return gargp;
}